

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

Result * __thiscall CoreML::Model::save(Result *__return_storage_ptr__,Model *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream **ppoVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  element_type *this_00;
  bool bVar4;
  _Alloc_hider _Var5;
  Result r;
  size_type __dnew;
  OstreamOutputStream rawOutput;
  Result local_b8;
  size_type local_90;
  string local_88;
  OstreamOutputStream local_68;
  
  if (*(int *)(out + *(long *)(*(long *)out + -0x18) + 0x20) == 0) {
    CoreML::downgradeSpecificationVersion
              ((this->m_spec).
               super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    validate(&local_b8,
             (this->m_spec).
             super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    bVar4 = Result::good(&local_b8);
    if (bVar4) {
      this_00 = (this->m_spec).
                super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      google::protobuf::io::OstreamOutputStream::OstreamOutputStream(&local_68,out,-1);
      bVar4 = google::protobuf::MessageLite::SerializeToZeroCopyStream
                        (&this_00->super_MessageLite,&local_68.super_ZeroCopyOutputStream);
      if (bVar4) {
        Result::Result(__return_storage_ptr__);
      }
      else {
        local_90 = 0x1a;
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        local_88._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_90);
        local_88.field_2._M_allocated_capacity = local_90;
        builtin_strncpy(local_88._M_dataplus._M_p,"unable to serialize object",0x1a);
        local_88._M_string_length = local_90;
        local_88._M_dataplus._M_p[local_90] = '\0';
        Result::Result(__return_storage_ptr__,FAILED_TO_SERIALIZE,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      google::protobuf::io::OstreamOutputStream::~OstreamOutputStream(&local_68);
    }
    else {
      paVar3 = &local_b8.m_message.field_2;
      __return_storage_ptr__->m_type = local_b8.m_type;
      __return_storage_ptr__->m_reason = local_b8.m_reason;
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.m_message._M_dataplus._M_p == paVar3) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_b8.m_message.field_2._M_allocated_capacity._1_7_,
                      local_b8.m_message.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
             local_b8.m_message.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_b8.m_message._M_dataplus._M_p;
        (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
             CONCAT71(local_b8.m_message.field_2._M_allocated_capacity._1_7_,
                      local_b8.m_message.field_2._M_local_buf[0]);
      }
      (__return_storage_ptr__->m_message)._M_string_length = local_b8.m_message._M_string_length;
      local_b8.m_message._M_string_length = 0;
      local_b8.m_message.field_2._M_local_buf[0] = '\0';
      local_b8.m_message._M_dataplus._M_p = (pointer)paVar3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.m_message._M_dataplus._M_p == &local_b8.m_message.field_2) {
      return __return_storage_ptr__;
    }
    local_68.copying_output_.output_ =
         (ostream *)
         CONCAT71(local_b8.m_message.field_2._M_allocated_capacity._1_7_,
                  local_b8.m_message.field_2._M_local_buf[0]);
    _Var5._M_p = local_b8.m_message._M_dataplus._M_p;
  }
  else {
    ppoVar2 = &local_68.copying_output_.output_;
    local_68.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = (_func_int **)ppoVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"unable to open file for write","");
    Result::Result(__return_storage_ptr__,UNABLE_TO_OPEN_FILE,(string *)&local_68);
    _Var5._M_p = (pointer)local_68.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream;
    if ((ostream **)local_68.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream == ppoVar2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(_Var5._M_p,(ulong)(local_68.copying_output_.output_ + 1));
  return __return_storage_ptr__;
}

Assistant:

Result Model::save(std::ostream& out) {
        if (!out.good()) {
            return Result(ResultType::UNABLE_TO_OPEN_FILE,
                          "unable to open file for write");
        }

        // Before saving the model, always downgrade the specification version to
        // the minimal version supporting everything this model needs
        downgradeSpecificationVersion();

        // validate on save
        Result r = validate();
        if (!r.good()) {
            return r;
        }
        
        return saveSpecification(*m_spec, out);
    }